

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_filesystem.cpp
# Opt level: O1

path * Omega_h::filesystem::current_path(void)

{
  int *piVar1;
  char *source;
  filesystem_error *this;
  path *in_RDI;
  char buf [1024];
  char acStack_418 [1032];
  
  piVar1 = __errno_location();
  *piVar1 = 0;
  source = getcwd(acStack_418,0x400);
  if (source != (char *)0x0) {
    path::path(in_RDI,source);
    return in_RDI;
  }
  this = (filesystem_error *)__cxa_allocate_exception(0x20);
  filesystem_error::filesystem_error(this,*piVar1,"current_path");
  __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

path current_path() {
  char buf[1024];
  errno = 0;
  char* ret = ::getcwd(buf, sizeof(buf));
  if (ret == nullptr) {
    throw filesystem_error(errno, "current_path");
  }
  return ret;
}